

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O2

void operator_delete(void *p,nothrow_t *param_2)

{
  tcmalloc::InvokeDeleteHook(p);
  DebugDeallocate(p,-0x145237f,0);
  return;
}

Assistant:

PERFTOOLS_DLL_DECL void tc_delete_nothrow(void* p, const std::nothrow_t&) PERFTOOLS_NOTHROW {
  tcmalloc::InvokeDeleteHook(p);
  DebugDeallocate(p, MallocBlock::kNewType, 0);
  force_frame();
}